

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otsu_method.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  string path;
  BMPImg grayscale_img;
  allocator local_a9;
  string local_a8;
  BMPImg local_88;
  
  if (argc == 2) {
    local_88.pixel_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.pixel_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.color_palette.
    super__Vector_base<simpleBMP::PaletteItem,_std::allocator<simpleBMP::PaletteItem>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.pixel_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.color_palette.
    super__Vector_base<simpleBMP::PaletteItem,_std::allocator<simpleBMP::PaletteItem>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.color_palette.
    super__Vector_base<simpleBMP::PaletteItem,_std::allocator<simpleBMP::PaletteItem>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.channel = 1;
    std::__cxx11::string::string((string *)&local_a8,argv[1],&local_a9);
    simpleBMP::BMPImg::LoadImage<void>(&local_88,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (local_88.info_header.biBitCount != 8) {
      __assert_fail("grayscale_img.info_header.biBitCount == 8 && \"Only support 8-bit gray-scale image\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/edimetia3d[P]simpleBMP/sample/otsu_method.cpp"
                    ,0x42,"int main(int, char **)");
    }
    Otsu(&local_88);
    std::__cxx11::string::string((string *)&local_a8,argv[1],&local_a9);
    std::__cxx11::string::append((char *)&local_a8);
    simpleBMP::BMPImg::SaveImage<void>(&local_88,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (local_88.pixel_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.pixel_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.color_palette.
        super__Vector_base<simpleBMP::PaletteItem,_std::allocator<simpleBMP::PaletteItem>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.color_palette.
                      super__Vector_base<simpleBMP::PaletteItem,_std::allocator<simpleBMP::PaletteItem>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar1 = 0;
  }
  else {
    main_cold_1();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2) {
    fprintf(stderr, "Usage: %s <path_to_input_image>\n", argv[0]);
    return 1;
  }
  simpleBMP::BMPImg grayscale_img;
  grayscale_img.LoadImage(argv[1]);
  assert(grayscale_img.info_header.biBitCount == 8 &&
         "Only support 8-bit gray-scale image");
  Otsu(&grayscale_img);

  std::string path = argv[1];
  path += ".otsu.bmp";
  grayscale_img.SaveImage(path);
  return 0;
}